

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_598;
  ulong local_560;
  int *local_558;
  int *local_550;
  pointer local_548;
  ulong local_540;
  ulong local_538;
  int *local_530;
  int *local_528;
  int *local_520;
  cpp_dec_float<50U,_int,_void> local_518;
  int *local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d8;
  cpp_dec_float<50U,_int,_void> local_4d0;
  cpp_dec_float<50U,_int,_void> local_498;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_418;
  cpp_dec_float<50U,_int,_void> local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_518.fpclass = cpp_dec_float_finite;
  local_518.prec_elem = 10;
  local_518.data._M_elems[0] = 0;
  local_518.data._M_elems[1] = 0;
  local_518.data._M_elems[2] = 0;
  local_518.data._M_elems[3] = 0;
  local_518.data._M_elems[4] = 0;
  local_518.data._M_elems[5] = 0;
  local_518.data._M_elems._24_5_ = 0;
  local_518.data._M_elems[7]._1_3_ = 0;
  local_518.data._M_elems._32_5_ = 0;
  local_518.data._M_elems[9]._1_3_ = 0;
  local_518.exp = 0;
  local_518.neg = false;
  local_598.fpclass = cpp_dec_float_finite;
  local_598.prec_elem = 10;
  local_598.data._M_elems[0] = 0;
  local_598.data._M_elems[1] = 0;
  local_598.data._M_elems[2] = 0;
  local_598.data._M_elems[3] = 0;
  local_598.data._M_elems[4] = 0;
  local_598.data._M_elems[5] = 0;
  local_598.data._M_elems._24_5_ = 0;
  local_598.data._M_elems[7]._1_3_ = 0;
  local_598.data._M_elems._32_5_ = 0;
  local_598.data._M_elems[9]._1_3_ = 0;
  local_598.exp = 0;
  local_598.neg = false;
  local_548 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (this->l).firstUpdate;
  uVar11 = 0;
  local_540 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    local_540 = uVar11;
  }
  local_550 = (this->l).idx;
  local_4e0 = (this->l).row;
  local_558 = (this->l).start;
  local_530 = ridx;
  local_528 = rn;
  local_4d8 = eps;
  while (uVar11 != local_540) {
    iVar6 = local_4e0[uVar11];
    uVar4 = *(undefined8 *)(vec2[iVar6].m_backend.data._M_elems + 8);
    local_598.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_598.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_598.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar6].m_backend.data._M_elems;
    local_598.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar6].m_backend.data._M_elems + 2);
    puVar1 = vec2[iVar6].m_backend.data._M_elems + 4;
    local_598.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar4 = *(undefined8 *)(puVar1 + 2);
    local_598.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_598.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_598.exp = vec2[iVar6].m_backend.exp;
    local_598.neg = vec2[iVar6].m_backend.neg;
    local_598.fpclass = vec2[iVar6].m_backend.fpclass;
    local_598.prec_elem = vec2[iVar6].m_backend.prec_elem;
    local_518.data._M_elems._0_8_ = *(undefined8 *)vec[iVar6].m_backend.data._M_elems;
    local_518.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar6].m_backend.data._M_elems + 4;
    local_518.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar4 = *(undefined8 *)(puVar1 + 2);
    local_518.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_518.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    uVar4 = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 8);
    local_518.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_518.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_518.exp = vec[iVar6].m_backend.exp;
    local_518.neg = vec[iVar6].m_backend.neg;
    local_418.m_backend.fpclass = vec[iVar6].m_backend.fpclass;
    local_418.m_backend.prec_elem = vec[iVar6].m_backend.prec_elem;
    local_518.prec_elem = local_418.m_backend.prec_elem;
    local_518.fpclass = local_418.m_backend.fpclass;
    local_418.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar6].m_backend.data._M_elems;
    local_418.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar6].m_backend.data._M_elems + 4;
    local_418.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_418.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_418.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 8);
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4d8->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_4d8->m_backend).data._M_elems + 2);
    local_168.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_4d8->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_4d8->m_backend).data._M_elems + 6);
    local_168.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_4d8->m_backend).data._M_elems + 8);
    local_168.m_backend.exp = (local_4d8->m_backend).exp;
    local_168.m_backend.neg = (local_4d8->m_backend).neg;
    local_168.m_backend.fpclass = (local_4d8->m_backend).fpclass;
    local_168.m_backend.prec_elem = (local_4d8->m_backend).prec_elem;
    local_418.m_backend.exp = local_518.exp;
    local_418.m_backend.neg = local_518.neg;
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_418,&local_168);
    piVar9 = local_558;
    local_560 = uVar11;
    if (bVar5) {
      iVar6 = local_558[uVar11];
      uVar8 = (ulong)iVar6;
      piVar7 = local_550 + uVar8;
      pcVar12 = &local_548[uVar8].m_backend;
      local_1a8.m_backend.data._M_elems[9]._1_3_ = local_598.data._M_elems[9]._1_3_;
      local_1a8.m_backend.data._M_elems._32_5_ = local_598.data._M_elems._32_5_;
      local_1a8.m_backend.data._M_elems[7]._1_3_ = local_598.data._M_elems[7]._1_3_;
      local_1a8.m_backend.data._M_elems._24_5_ = local_598.data._M_elems._24_5_;
      local_1a8.m_backend.data._M_elems[4] = local_598.data._M_elems[4];
      local_1a8.m_backend.data._M_elems[5] = local_598.data._M_elems[5];
      local_1a8.m_backend.data._M_elems[0] = local_598.data._M_elems[0];
      local_1a8.m_backend.data._M_elems[1] = local_598.data._M_elems[1];
      local_1a8.m_backend.data._M_elems[2] = local_598.data._M_elems[2];
      local_1a8.m_backend.data._M_elems[3] = local_598.data._M_elems[3];
      local_1a8.m_backend.exp = local_598.exp;
      local_1a8.m_backend.neg = local_598.neg;
      local_1a8.m_backend.fpclass = local_598.fpclass;
      local_1a8.m_backend.prec_elem = local_598.prec_elem;
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_1e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_1e8.m_backend.exp = (eps2->m_backend).exp;
      local_1e8.m_backend.neg = (eps2->m_backend).neg;
      local_1e8.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_1e8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1a8,&local_1e8);
      iVar10 = piVar9[uVar11 + 1];
      uVar11 = uVar8;
      if (bVar5) {
        for (; local_538 = uVar11, (int)uVar8 < iVar10; iVar10 = iVar10 + -1) {
          iVar6 = *piVar7;
          local_520 = piVar7 + 1;
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_68,&local_518,pcVar12);
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_68,iVar6,vec + iVar6,local_530,local_528);
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_a8,&local_598,pcVar12);
          piVar7 = local_520;
          uVar8 = local_538;
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_a8,iVar6,vec2 + iVar6,ridx2,rn2);
          pcVar12 = pcVar12 + 1;
          uVar11 = local_538;
        }
      }
      else {
        for (; iVar6 < iVar10; iVar10 = iVar10 + -1) {
          iVar3 = *piVar7;
          piVar7 = piVar7 + 1;
          local_e8.fpclass = cpp_dec_float_finite;
          local_e8.prec_elem = 10;
          local_e8.data._M_elems[0] = 0;
          local_e8.data._M_elems[1] = 0;
          local_e8.data._M_elems[2] = 0;
          local_e8.data._M_elems[3] = 0;
          local_e8.data._M_elems[4] = 0;
          local_e8.data._M_elems[5] = 0;
          local_e8.data._M_elems._24_5_ = 0;
          local_e8.data._M_elems[7]._1_3_ = 0;
          local_e8.data._M_elems._32_5_ = 0;
          local_e8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_e8,&local_518,pcVar12);
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_e8,iVar3,vec + iVar3,local_530,local_528);
          pcVar12 = pcVar12 + 1;
        }
      }
    }
    else {
      local_228.m_backend.data._M_elems[9]._1_3_ = local_598.data._M_elems[9]._1_3_;
      local_228.m_backend.data._M_elems._32_5_ = local_598.data._M_elems._32_5_;
      local_228.m_backend.data._M_elems[7]._1_3_ = local_598.data._M_elems[7]._1_3_;
      local_228.m_backend.data._M_elems._24_5_ = local_598.data._M_elems._24_5_;
      local_228.m_backend.data._M_elems[4] = local_598.data._M_elems[4];
      local_228.m_backend.data._M_elems[5] = local_598.data._M_elems[5];
      local_228.m_backend.data._M_elems[0] = local_598.data._M_elems[0];
      local_228.m_backend.data._M_elems[1] = local_598.data._M_elems[1];
      local_228.m_backend.data._M_elems[2] = local_598.data._M_elems[2];
      local_228.m_backend.data._M_elems[3] = local_598.data._M_elems[3];
      local_228.m_backend.exp = local_598.exp;
      local_228.m_backend.neg = local_598.neg;
      local_228.m_backend.fpclass = local_598.fpclass;
      local_228.m_backend.prec_elem = local_598.prec_elem;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_268.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_268.m_backend.exp = (eps2->m_backend).exp;
      local_268.m_backend.neg = (eps2->m_backend).neg;
      local_268.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_268.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_228,&local_268);
      if (bVar5) {
        iVar6 = local_558[local_560];
        piVar9 = local_550 + iVar6;
        pcVar12 = &local_548[iVar6].m_backend;
        for (iVar10 = local_558[local_560 + 1]; iVar6 < iVar10; iVar10 = iVar10 + -1) {
          iVar3 = *piVar9;
          piVar9 = piVar9 + 1;
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems._24_5_ = 0;
          local_128.data._M_elems[7]._1_3_ = 0;
          local_128.data._M_elems._32_5_ = 0;
          local_128._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_128,&local_598,pcVar12);
          updateSolutionVectorLright
                    (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_128,iVar3,vec2 + iVar3,ridx2,rn2);
          pcVar12 = pcVar12 + 1;
        }
      }
    }
    uVar11 = local_560 + 1;
  }
  if ((this->l).updateType != 0) {
    local_560 = (ulong)(this->l).firstUnused;
    uVar11 = local_540;
    while (piVar9 = local_558, (long)uVar11 < (long)local_560) {
      local_520 = (int *)(long)local_558[uVar11];
      piVar7 = local_550 + (long)local_520;
      pcVar12 = &local_548[(long)local_520].m_backend;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_4d0);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_3e0);
      local_538 = uVar11 + 1;
      local_540 = uVar11;
      for (iVar6 = piVar9[uVar11 + 1]; (int)local_520 < iVar6; iVar6 = iVar6 + -1) {
        local_498.fpclass = cpp_dec_float_finite;
        local_498.prec_elem = 10;
        local_498.data._M_elems[0] = 0;
        local_498.data._M_elems[1] = 0;
        local_498.data._M_elems[2] = 0;
        local_498.data._M_elems[3] = 0;
        local_498.data._M_elems[4] = 0;
        local_498.data._M_elems[5] = 0;
        local_498.data._M_elems._24_5_ = 0;
        local_498.data._M_elems[7]._1_3_ = 0;
        local_498.data._M_elems._32_5_ = 0;
        local_498._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_498,&vec[*piVar7].m_backend,pcVar12);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_4d0,&local_498);
        iVar10 = *piVar7;
        piVar7 = piVar7 + 1;
        local_498.fpclass = cpp_dec_float_finite;
        local_498.prec_elem = 10;
        local_498.data._M_elems[0] = 0;
        local_498.data._M_elems[1] = 0;
        local_498.data._M_elems[2] = 0;
        local_498.data._M_elems[3] = 0;
        local_498.data._M_elems[4] = 0;
        local_498.data._M_elems[5] = 0;
        local_498.data._M_elems._24_5_ = 0;
        local_498.data._M_elems[7]._1_3_ = 0;
        local_498.data._M_elems._32_5_ = 0;
        local_498._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_498,&vec2[iVar10].m_backend,pcVar12);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_3e0,&local_498);
        pcVar12 = pcVar12 + 1;
      }
      local_518.data._M_elems._32_5_ = local_4d0.data._M_elems._32_5_;
      local_518.data._M_elems[9]._1_3_ = local_4d0.data._M_elems[9]._1_3_;
      local_518.data._M_elems[4] = local_4d0.data._M_elems[4];
      local_518.data._M_elems[5] = local_4d0.data._M_elems[5];
      local_518.data._M_elems._24_5_ = local_4d0.data._M_elems._24_5_;
      local_518.data._M_elems[7]._1_3_ = local_4d0.data._M_elems[7]._1_3_;
      local_518.data._M_elems[0] = local_4d0.data._M_elems[0];
      local_518.data._M_elems[1] = local_4d0.data._M_elems[1];
      local_518.data._M_elems[2] = local_4d0.data._M_elems[2];
      local_518.data._M_elems[3] = local_4d0.data._M_elems[3];
      local_518.exp = local_4d0.exp;
      local_518.neg = local_4d0.neg;
      local_518.prec_elem = local_4d0.prec_elem;
      local_518.fpclass = local_4d0.fpclass;
      local_598.data._M_elems[0] = local_3e0.data._M_elems[0];
      local_598.data._M_elems[1] = local_3e0.data._M_elems[1];
      local_598.data._M_elems[2] = local_3e0.data._M_elems[2];
      local_598.data._M_elems[3] = local_3e0.data._M_elems[3];
      local_598.data._M_elems[4] = local_3e0.data._M_elems[4];
      local_598.data._M_elems[5] = local_3e0.data._M_elems[5];
      local_598.data._M_elems._24_5_ = local_3e0.data._M_elems._24_5_;
      local_598.data._M_elems[7]._1_3_ = local_3e0.data._M_elems[7]._1_3_;
      local_598.data._M_elems._32_5_ = local_3e0.data._M_elems._32_5_;
      local_598.data._M_elems[9]._1_3_ = local_3e0.data._M_elems[9]._1_3_;
      local_598.exp = local_3e0.exp;
      local_598.neg = local_3e0.neg;
      local_598.fpclass = local_3e0.fpclass;
      local_598.prec_elem = local_3e0.prec_elem;
      iVar6 = local_4e0[local_540];
      local_458.m_backend.data._M_elems[8] = local_4d0.data._M_elems[8];
      local_458.m_backend.data._M_elems[9] = local_4d0.data._M_elems[9];
      local_458.m_backend.data._M_elems[4] = local_4d0.data._M_elems[4];
      local_458.m_backend.data._M_elems[5] = local_4d0.data._M_elems[5];
      local_458.m_backend.data._M_elems[6] = local_4d0.data._M_elems[6];
      local_458.m_backend.data._M_elems[7] = local_4d0.data._M_elems[7];
      local_458.m_backend.data._M_elems[0] = local_4d0.data._M_elems[0];
      local_458.m_backend.data._M_elems[1] = local_4d0.data._M_elems[1];
      local_458.m_backend.data._M_elems[2] = local_4d0.data._M_elems[2];
      local_458.m_backend.data._M_elems[3] = local_4d0.data._M_elems[3];
      local_458.m_backend.exp = local_4d0.exp;
      local_458.m_backend.neg = local_4d0.neg;
      local_458.m_backend.fpclass = local_4d0.fpclass;
      local_458.m_backend.prec_elem = local_4d0.prec_elem;
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_4d8->m_backend).data._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_4d8->m_backend).data._M_elems + 2);
      local_2a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_4d8->m_backend).data._M_elems + 4);
      local_2a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_4d8->m_backend).data._M_elems + 6);
      local_2a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_4d8->m_backend).data._M_elems + 8);
      local_2a8.m_backend.exp = (local_4d8->m_backend).exp;
      local_2a8.m_backend.neg = (local_4d8->m_backend).neg;
      local_2a8.m_backend.fpclass = (local_4d8->m_backend).fpclass;
      local_2a8.m_backend.prec_elem = (local_4d8->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_458,&local_2a8);
      if (bVar5) {
        local_2e8.m_backend.data._M_elems[9]._1_3_ = local_518.data._M_elems[9]._1_3_;
        local_2e8.m_backend.data._M_elems._32_5_ = local_518.data._M_elems._32_5_;
        local_2e8.m_backend.data._M_elems[7]._1_3_ = local_518.data._M_elems[7]._1_3_;
        local_2e8.m_backend.data._M_elems._24_5_ = local_518.data._M_elems._24_5_;
        local_2e8.m_backend.data._M_elems[4] = local_518.data._M_elems[4];
        local_2e8.m_backend.data._M_elems[5] = local_518.data._M_elems[5];
        local_2e8.m_backend.data._M_elems[0] = local_518.data._M_elems[0];
        local_2e8.m_backend.data._M_elems[1] = local_518.data._M_elems[1];
        local_2e8.m_backend.data._M_elems[2] = local_518.data._M_elems[2];
        local_2e8.m_backend.data._M_elems[3] = local_518.data._M_elems[3];
        local_2e8.m_backend.exp = local_518.exp;
        local_2e8.m_backend.neg = local_518.neg;
        local_2e8.m_backend.fpclass = local_518.fpclass;
        local_2e8.m_backend.prec_elem = local_518.prec_elem;
        updateSolutionVectorLright(this,&local_2e8,iVar6,vec + iVar6,local_530,local_528);
      }
      local_328.m_backend.data._M_elems[9]._1_3_ = local_598.data._M_elems[9]._1_3_;
      local_328.m_backend.data._M_elems._32_5_ = local_598.data._M_elems._32_5_;
      local_328.m_backend.data._M_elems[7]._1_3_ = local_598.data._M_elems[7]._1_3_;
      local_328.m_backend.data._M_elems._24_5_ = local_598.data._M_elems._24_5_;
      local_328.m_backend.data._M_elems[4] = local_598.data._M_elems[4];
      local_328.m_backend.data._M_elems[5] = local_598.data._M_elems[5];
      local_328.m_backend.data._M_elems[0] = local_598.data._M_elems[0];
      local_328.m_backend.data._M_elems[1] = local_598.data._M_elems[1];
      local_328.m_backend.data._M_elems[2] = local_598.data._M_elems[2];
      local_328.m_backend.data._M_elems[3] = local_598.data._M_elems[3];
      local_328.m_backend.exp = local_598.exp;
      local_328.m_backend.neg = local_598.neg;
      local_328.m_backend.fpclass = local_598.fpclass;
      local_328.m_backend.prec_elem = local_598.prec_elem;
      local_368.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_368.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_368.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_368.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_368.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_368.m_backend.exp = (eps2->m_backend).exp;
      local_368.m_backend.neg = (eps2->m_backend).neg;
      local_368.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_368.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_328,&local_368);
      uVar11 = local_538;
      if (bVar5) {
        local_3a8.m_backend.data._M_elems[9]._1_3_ = local_598.data._M_elems[9]._1_3_;
        local_3a8.m_backend.data._M_elems._32_5_ = local_598.data._M_elems._32_5_;
        local_3a8.m_backend.data._M_elems[7]._1_3_ = local_598.data._M_elems[7]._1_3_;
        local_3a8.m_backend.data._M_elems._24_5_ = local_598.data._M_elems._24_5_;
        local_3a8.m_backend.data._M_elems[4] = local_598.data._M_elems[4];
        local_3a8.m_backend.data._M_elems[5] = local_598.data._M_elems[5];
        local_3a8.m_backend.data._M_elems[0] = local_598.data._M_elems[0];
        local_3a8.m_backend.data._M_elems[1] = local_598.data._M_elems[1];
        local_3a8.m_backend.data._M_elems[2] = local_598.data._M_elems[2];
        local_3a8.m_backend.data._M_elems[3] = local_598.data._M_elems[3];
        local_3a8.m_backend.exp = local_598.exp;
        local_3a8.m_backend.neg = local_598.neg;
        local_3a8.m_backend.fpclass = local_598.fpclass;
        local_3a8.m_backend.prec_elem = local_598.prec_elem;
        updateSolutionVectorLright(this,&local_3a8,iVar6,vec2 + iVar6,ridx2,rn2);
        uVar11 = local_538;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}